

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::HTTPRequester::ContinueReadingBody(HTTPRequester *this)

{
  pointer puVar1;
  long lVar2;
  ulong uVar3;
  pointer puVar4;
  size_t sVar5;
  Result success;
  error_code local_158;
  istream is;
  
  if (this->Done == false) {
    std::istream::istream(&is,&(this->TCPStreamBuf).super_streambuf);
    do {
      lVar2 = std::streambuf::in_avail();
      if (lVar2 < 1) {
        puVar4 = (this->BodyContent).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar5 = this->ContentLength;
        uVar3 = (long)(this->BodyContent).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar4;
        break;
      }
      puVar4 = (this->BodyContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = (this->BodyContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = std::streambuf::in_avail();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->BodyContent,(size_type)(puVar4 + (lVar2 - (long)puVar1)));
      std::istream::read((char *)&is,
                         (long)(puVar4 + ((long)(this->BodyContent).
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start -
                                         (long)puVar1)));
      puVar4 = (this->BodyContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = this->ContentLength;
      uVar3 = (long)(this->BodyContent).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4;
    } while (uVar3 < sVar5);
    if (uVar3 < sVar5) {
      this->AsyncRefs = this->AsyncRefs + 1;
      success.Error = (ErrorResult *)(ulong)((uint)sVar5 - (int)uVar3);
      local_158._M_value = 0;
      local_158._M_cat = (error_category *)std::_V2::system_category();
      asio::detail::
      read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
      ::operator()((read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
                    *)&success,&local_158,0,1);
    }
    else {
      success.Error = (ErrorResult *)0x0;
      OnDone(this,&success,this->HTTPStatusCode,(char *)puVar4,(uint)sVar5);
      Result::~Result(&success);
    }
    std::istream::~istream(&is);
  }
  return;
}

Assistant:

void HTTPRequester::ContinueReadingBody()
{
    if (Done) {
        return;
    }

    std::istream is(&TCPStreamBuf);

    while (TCPStreamBuf.in_avail() > 0)
    {
        // Append bytes from the multiple buffers backing TCPStreamBuf
        // into the single contiguous buffer of body content we will return
        const size_t priorBytes = BodyContent.size();
        const size_t availBytes = (size_t)TCPStreamBuf.in_avail();
        BodyContent.resize(priorBytes + availBytes);
        is.read((char*)BodyContent.data() + priorBytes, availBytes);

        // If we are done:
        if (ContentLength <= BodyContent.size()) {
            break;
        }
    }

    // If we are done:
    if (ContentLength <= BodyContent.size())
    {
        const Result success = Result::Success();
        OnDone(success, HTTPStatusCode, (char*)BodyContent.data(), (unsigned)ContentLength);
        return;
    }

    // Read enough to fill the BodyContent buffer
    unsigned readCount = static_cast<unsigned>(ContentLength - BodyContent.size());

    // Request to read exactly the amount left in the body
    ++AsyncRefs;
    asio::async_read(
        *Socket_TCP,
        TCPStreamBuf,
        asio::transfer_exactly(readCount),
        [this](const asio::error_code& ec, size_t bytes)
    {
        --AsyncRefs;

        // If the socket was closed:
        if (bytes <= 0 || ec)
        {
            Result result = Result("Connection closed", ec.message(), ErrorType::Asio, ec.value());
            OnDone(result);
            return;
        }

        ContinueReadingBody();
    });
}